

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

ostream * operator<<(ostream *out,
                    vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *v)

{
  ostream *poVar1;
  pointer pcVar2;
  pointer pcVar3;
  long lVar4;
  ulong uVar5;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  pcVar3 = (v->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (v->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if ((long)pcVar2 - (long)pcVar3 != 0x10) {
    lVar4 = 0;
    uVar5 = 0;
    do {
      poVar1 = std::operator<<(out,(complex *)(pcVar3->_M_value + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      uVar5 = uVar5 + 1;
      pcVar3 = (v->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar2 = (v->super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < ((long)pcVar2 - (long)pcVar3 >> 4) - 1U);
  }
  poVar1 = std::operator<<(out,(complex *)(pcVar2 + -1));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const std::vector<T> &v)
{
    out << "[";
    for (auto i = 0; i < v.size() - 1; i++)
    {
        out << v[i] << ", ";
    }
    out << v.back() << "]";

    return out;
}